

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d603ce::SegmentTree::produceIntersections
          (SegmentTree *this,TreeNode *node,int segment,RectF *segmentBounds,RectF *nodeBounds,
          int axis)

{
  long in_RCX;
  int in_EDX;
  SegmentTree *in_RSI;
  QList<(anonymous_namespace)::TreeNode> *in_RDI;
  RectF *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  RectF rbounds;
  RectF lbounds;
  qsizetype in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  qreal local_48 [2];
  undefined8 in_stack_ffffffffffffffc8;
  TreeNode *in_stack_ffffffffffffffd0;
  SegmentTree *in_stack_ffffffffffffffd8;
  qreal local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(in_RSI->m_index).d.ptr & 1) == 0) {
    local_18[0] = in_R8->x2;
    local_18[1] = in_R8->y2;
    local_18[in_R9D] = (qreal)in_RSI->m_segments;
    local_48[0] = in_R8->x1;
    local_48[1] = in_R8->y1;
    local_48[in_R9D] = (qreal)(in_RSI->m_index).d.d;
    if ((*(int *)((long)&(in_RSI->m_index).d.ptr + 4) < in_EDX) &&
       (*(double *)(in_RCX + (long)in_R9D * 8) <= (double)in_RSI->m_segments)) {
      QList<(anonymous_namespace)::TreeNode>::at(in_RDI,in_stack_ffffffffffffff78);
      produceIntersections
                (in_RSI,(TreeNode *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_RCX >> 0x20),in_R8,
                 (RectF *)CONCAT44(in_R9D,in_stack_ffffffffffffff88),(int)((ulong)in_RDI >> 0x20));
    }
    if (((int)(in_RSI->m_index).d.size < in_EDX) &&
       ((double)(in_RSI->m_index).d.d <= *(double *)(in_RCX + 0x10 + (long)in_R9D * 8))) {
      QList<(anonymous_namespace)::TreeNode>::at(in_RDI,in_stack_ffffffffffffff78);
      produceIntersections
                (in_RSI,(TreeNode *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_RCX >> 0x20),in_R8,
                 (RectF *)CONCAT44(in_R9D,in_stack_ffffffffffffff88),(int)((ulong)in_RDI >> 0x20));
    }
  }
  else {
    produceIntersectionsLeaf
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SegmentTree::produceIntersections(const TreeNode &node, int segment, const RectF &segmentBounds, const RectF &nodeBounds, int axis)
{
    if (node.leaf) {
        produceIntersectionsLeaf(node, segment);
        return;
    }

    RectF lbounds = nodeBounds;
    (&lbounds.x2)[axis] = node.splitLeft;

    RectF rbounds = nodeBounds;
    (&rbounds.x1)[axis] = node.splitRight;

    if (segment > node.lowestLeftIndex && (&segmentBounds.x1)[axis] <= node.splitLeft)
        produceIntersections(m_tree.at(node.index.children.left), segment, segmentBounds, lbounds, !axis);

    if (segment > node.lowestRightIndex && (&segmentBounds.x2)[axis] >= node.splitRight)
        produceIntersections(m_tree.at(node.index.children.right), segment, segmentBounds, rbounds, !axis);
}